

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# permute.cpp
# Opt level: O1

int __thiscall ncnn::Permute::forward(Permute *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint _c;
  uint _h;
  uint uVar1;
  uint _w;
  int iVar2;
  size_t sVar3;
  int *piVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  int iVar8;
  int iVar9;
  void *pvVar10;
  void *pvVar11;
  ulong uVar12;
  ulong uVar13;
  undefined4 *puVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  undefined4 *puVar18;
  void *pvVar19;
  void *pvVar20;
  undefined4 *puVar21;
  ulong uVar22;
  ulong uVar23;
  
  _c = bottom_blob->w;
  uVar13 = (ulong)_c;
  _h = bottom_blob->h;
  uVar23 = (ulong)_h;
  sVar3 = bottom_blob->elemsize;
  uVar1 = this->order_type;
  if (bottom_blob->dims == 2) {
    if (uVar1 == 1) {
      Mat::create(top_blob,_h,_c,sVar3,opt->blob_allocator);
      pvVar11 = top_blob->data;
      if (pvVar11 == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      if ((int)_c < 1) {
        return 0;
      }
      puVar18 = (undefined4 *)bottom_blob->data;
      uVar15 = 0;
      do {
        if (0 < (int)_h) {
          uVar17 = 0;
          puVar14 = puVar18;
          do {
            *(undefined4 *)((long)pvVar11 + uVar17 * 4) = *puVar14;
            uVar17 = uVar17 + 1;
            puVar14 = puVar14 + uVar13;
          } while (uVar23 != uVar17);
        }
        uVar15 = uVar15 + 1;
        pvVar11 = (void *)((long)pvVar11 + uVar23 * 4);
        puVar18 = puVar18 + 1;
      } while (uVar15 != uVar13);
    }
    else {
      if (uVar1 != 0) {
        return 0;
      }
switchD_0017986e_caseD_0:
      if (top_blob == bottom_blob) {
        return 0;
      }
      piVar4 = bottom_blob->refcount;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + 1;
        UNLOCK();
      }
      piVar4 = top_blob->refcount;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(top_blob->data);
            }
          }
          else {
            (**(code **)(*(long *)top_blob->allocator + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->c = 0;
      top_blob->cstep = 0;
      top_blob->data = bottom_blob->data;
      top_blob->refcount = bottom_blob->refcount;
      top_blob->elemsize = bottom_blob->elemsize;
      top_blob->elempack = bottom_blob->elempack;
      top_blob->allocator = bottom_blob->allocator;
      iVar9 = bottom_blob->w;
      iVar2 = bottom_blob->h;
      iVar8 = bottom_blob->c;
      top_blob->dims = bottom_blob->dims;
      top_blob->w = iVar9;
      top_blob->h = iVar2;
      top_blob->c = iVar8;
      top_blob->cstep = bottom_blob->cstep;
    }
    iVar9 = 0;
  }
  else {
    if (5 < uVar1) {
      return 0;
    }
    _w = bottom_blob->c;
    uVar15 = (ulong)_w;
    switch(uVar1) {
    case 0:
      goto switchD_0017986e_caseD_0;
    case 1:
      Mat::create(top_blob,_h,_c,_w,sVar3,opt->blob_allocator);
      iVar9 = -100;
      if (((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) &&
         (iVar9 = 0, 0 < (int)_w)) {
        puVar18 = (undefined4 *)bottom_blob->data;
        sVar3 = bottom_blob->cstep;
        pvVar11 = top_blob->data;
        sVar5 = top_blob->cstep;
        sVar6 = top_blob->elemsize;
        sVar7 = bottom_blob->elemsize;
        uVar17 = 0;
        do {
          if (0 < (int)_c) {
            uVar22 = 0;
            puVar14 = puVar18;
            pvVar20 = pvVar11;
            do {
              if (0 < (int)_h) {
                uVar12 = 0;
                puVar21 = puVar14;
                do {
                  *(undefined4 *)((long)pvVar20 + uVar12 * 4) = *puVar21;
                  uVar12 = uVar12 + 1;
                  puVar21 = puVar21 + uVar13;
                } while (uVar23 != uVar12);
              }
              uVar22 = uVar22 + 1;
              pvVar20 = (void *)((long)pvVar20 + uVar23 * 4);
              puVar14 = puVar14 + 1;
            } while (uVar22 != uVar13);
          }
          uVar17 = uVar17 + 1;
          pvVar11 = (void *)((long)pvVar11 + sVar5 * sVar6);
          puVar18 = (undefined4 *)((long)puVar18 + sVar3 * sVar7);
          iVar9 = 0;
        } while (uVar17 != uVar15);
      }
      break;
    case 2:
      Mat::create(top_blob,_c,_w,_h,sVar3,opt->blob_allocator);
      iVar9 = -100;
      if (((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) &&
         (iVar9 = 0, 0 < (int)_h)) {
        pvVar11 = top_blob->data;
        sVar3 = top_blob->cstep;
        iVar2 = bottom_blob->w;
        pvVar20 = bottom_blob->data;
        sVar5 = bottom_blob->elemsize;
        sVar6 = top_blob->elemsize;
        sVar7 = bottom_blob->cstep;
        uVar17 = 0;
        do {
          if (0 < (int)_w) {
            uVar22 = 0;
            pvVar10 = pvVar20;
            pvVar19 = pvVar11;
            do {
              if (0 < (int)_c) {
                uVar12 = 0;
                do {
                  *(undefined4 *)((long)pvVar19 + uVar12 * 4) =
                       *(undefined4 *)((long)pvVar10 + uVar12 * 4);
                  uVar12 = uVar12 + 1;
                } while (uVar13 != uVar12);
              }
              uVar22 = uVar22 + 1;
              pvVar19 = (void *)((long)pvVar19 + uVar13 * 4);
              pvVar10 = (void *)((long)pvVar10 + sVar5 * sVar7);
            } while (uVar22 != uVar15);
          }
          uVar17 = uVar17 + 1;
          pvVar11 = (void *)((long)pvVar11 + sVar3 * sVar6);
          pvVar20 = (void *)((long)pvVar20 + (long)iVar2 * sVar5);
          iVar9 = 0;
        } while (uVar17 != uVar23);
      }
      break;
    case 3:
      Mat::create(top_blob,_w,_c,_h,sVar3,opt->blob_allocator);
      iVar9 = -100;
      if (((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) &&
         (iVar9 = 0, 0 < (int)_h)) {
        pvVar11 = top_blob->data;
        sVar3 = top_blob->cstep;
        sVar5 = top_blob->elemsize;
        uVar17 = 0;
        do {
          if (0 < (int)_c) {
            sVar6 = bottom_blob->elemsize;
            puVar18 = (undefined4 *)
                      ((long)(bottom_blob->w * (int)uVar17) * sVar6 + (long)bottom_blob->data);
            sVar7 = bottom_blob->cstep;
            uVar22 = 0;
            pvVar20 = pvVar11;
            do {
              if (0 < (int)_w) {
                uVar12 = 0;
                puVar14 = puVar18;
                do {
                  *(undefined4 *)((long)pvVar20 + uVar12 * 4) = *puVar14;
                  uVar12 = uVar12 + 1;
                  puVar14 = (undefined4 *)((long)puVar14 + sVar6 * sVar7);
                } while (uVar15 != uVar12);
              }
              uVar22 = uVar22 + 1;
              pvVar20 = (void *)((long)pvVar20 + uVar15 * 4);
              puVar18 = puVar18 + 1;
            } while (uVar22 != uVar13);
          }
          uVar17 = uVar17 + 1;
          pvVar11 = (void *)((long)pvVar11 + sVar3 * sVar5);
          iVar9 = 0;
        } while (uVar17 != uVar23);
      }
      break;
    case 4:
      Mat::create(top_blob,_h,_w,_c,sVar3,opt->blob_allocator);
      iVar9 = -100;
      if (((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) &&
         (iVar9 = 0, 0 < (int)_c)) {
        pvVar11 = top_blob->data;
        sVar3 = top_blob->cstep;
        puVar18 = (undefined4 *)bottom_blob->data;
        sVar5 = bottom_blob->cstep;
        sVar6 = top_blob->elemsize;
        sVar7 = bottom_blob->elemsize;
        uVar17 = 0;
        do {
          if (0 < (int)_w) {
            uVar22 = 0;
            puVar14 = puVar18;
            pvVar20 = pvVar11;
            do {
              if (0 < (int)_h) {
                uVar12 = 0;
                puVar21 = puVar14;
                do {
                  *(undefined4 *)((long)pvVar20 + uVar12 * 4) = *puVar21;
                  uVar12 = uVar12 + 1;
                  puVar21 = puVar21 + uVar13;
                } while (uVar23 != uVar12);
              }
              uVar22 = uVar22 + 1;
              pvVar20 = (void *)((long)pvVar20 + uVar23 * 4);
              puVar14 = (undefined4 *)((long)puVar14 + sVar5 * sVar7);
            } while (uVar22 != uVar15);
          }
          uVar17 = uVar17 + 1;
          pvVar11 = (void *)((long)pvVar11 + sVar3 * sVar6);
          puVar18 = puVar18 + 1;
          iVar9 = 0;
        } while (uVar17 != uVar13);
      }
      break;
    case 5:
      Mat::create(top_blob,_w,_h,_c,sVar3,opt->blob_allocator);
      iVar9 = -100;
      if (((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) &&
         (iVar9 = 0, 0 < (int)_c)) {
        pvVar11 = top_blob->data;
        sVar3 = top_blob->cstep;
        sVar5 = top_blob->elemsize;
        lVar16 = 0;
        uVar17 = 0;
        do {
          if (0 < (int)_h) {
            sVar6 = bottom_blob->cstep;
            sVar7 = bottom_blob->elemsize;
            puVar18 = (undefined4 *)((long)bottom_blob->data + lVar16);
            uVar22 = 0;
            pvVar20 = pvVar11;
            do {
              if (0 < (int)_w) {
                uVar12 = 0;
                puVar14 = puVar18;
                do {
                  *(undefined4 *)((long)pvVar20 + uVar12 * 4) = *puVar14;
                  uVar12 = uVar12 + 1;
                  puVar14 = (undefined4 *)((long)puVar14 + sVar6 * sVar7);
                } while (uVar15 != uVar12);
              }
              uVar22 = uVar22 + 1;
              pvVar20 = (void *)((long)pvVar20 + uVar15 * 4);
              puVar18 = puVar18 + uVar13;
            } while (uVar22 != uVar23);
          }
          uVar17 = uVar17 + 1;
          pvVar11 = (void *)((long)pvVar11 + sVar3 * sVar5);
          lVar16 = lVar16 + 4;
          iVar9 = 0;
        } while (uVar17 != uVar13);
      }
    }
  }
  return iVar9;
}

Assistant:

int Permute::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    int dims = bottom_blob.dims;

    if (dims == 2)
    {
        // order_type
        // 0 = w h
        // 1 = h w

        if (order_type == 0)
        {
            top_blob = bottom_blob;
        }
        else if (order_type == 1)
        {
            top_blob.create(h, w, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            const float* ptr = bottom_blob;
            float* outptr = top_blob;

            for (int i = 0; i < w; i++)
            {
                for (int j = 0; j < h; j++)
                {
                    outptr[i*h + j] = ptr[j*w + i];
                }
            }
        }

        return 0;
    }

    // order_type
    // 0 = w h c
    // 1 = h w c
    // 2 = w c h
    // 3 = c w h
    // 4 = h c w
    // 5 = c h w

    if (order_type == 0)
    {
        top_blob = bottom_blob;
    }
    else if (order_type == 1)
    {
        top_blob.create(h, w, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < w; i++)
            {
                for (int j = 0; j < h; j++)
                {
                    outptr[i*h + j] = ptr[j*w + i];
                }
            }
        }
    }
    else if (order_type == 2)
    {
        top_blob.create(w, channels, h, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<h; q++)
        {
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < channels; i++)
            {
                const float* ptr = bottom_blob.channel(i).row(q);

                for (int j = 0; j < w; j++)
                {
                    outptr[i*w + j] = ptr[j];
                }
            }
        }
    }
    else if (order_type == 3)
    {
        top_blob.create(channels, w, h, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<h; q++)
        {
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < w; i++)
            {
                for (int j = 0; j < channels; j++)
                {
                    const float* ptr = bottom_blob.channel(j).row(q);

                    outptr[i*channels + j] = ptr[i];
                }
            }
        }
    }
    else if (order_type == 4)
    {
        top_blob.create(h, channels, w, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<w; q++)
        {
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < channels; i++)
            {
                const float* ptr = bottom_blob.channel(i);

                for (int j = 0; j < h; j++)
                {
                    outptr[i*h + j] = ptr[j*w + q];
                }
            }
        }
    }
    else if (order_type == 5)
    {
        top_blob.create(channels, h, w, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<w; q++)
        {
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < channels; j++)
                {
                    const float* ptr = bottom_blob.channel(j);

                    outptr[i*channels + j] = ptr[i*w + q];
                }
            }
        }
    }

    return 0;
}